

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizerParameters.cpp
# Opt level: O0

void __thiscall OpenMD::MinimizerParameters::validate(MinimizerParameters *this)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  int data;
  undefined8 uVar4;
  ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
  *this_00;
  undefined8 uVar5;
  long in_RDI;
  double dVar6;
  RealType oneR;
  RealType zero;
  int mi;
  int one;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff4b8;
  undefined6 in_stack_fffffffffffff4c0;
  undefined1 in_stack_fffffffffffff4c6;
  undefined1 in_stack_fffffffffffff4c7;
  AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
  *in_stack_fffffffffffff4d0;
  allocator<char> *in_stack_fffffffffffff4f0;
  string *in_stack_fffffffffffff4f8;
  undefined6 in_stack_fffffffffffff500;
  undefined1 in_stack_fffffffffffff506;
  undefined1 in_stack_fffffffffffff507;
  ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>_> *in_stack_fffffffffffff520;
  ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_> *in_stack_fffffffffffff528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff540;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  *in_stack_fffffffffffff548;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_fffffffffffff550;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *cons2;
  undefined6 in_stack_fffffffffffff558;
  undefined1 in_stack_fffffffffffff55e;
  undefined1 in_stack_fffffffffffff55f;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_fffffffffffff5b0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_fffffffffffff5b8;
  string local_9c0 [256];
  string local_8c0 [32];
  PositiveConstraint local_8a0 [2];
  string local_860 [32];
  PositiveConstraint local_840 [7];
  string local_760 [224];
  undefined8 local_680;
  undefined8 local_678;
  int local_670;
  undefined4 local_66c;
  ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_> local_668;
  string local_648 [32];
  PositiveConstraint local_628;
  allocator<char> local_601;
  string local_600 [103];
  allocator<char> local_599;
  string local_598 [103];
  undefined1 local_531 [513];
  string local_330 [32];
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [103];
  allocator<char> local_281;
  string local_280 [119];
  allocator<char> local_209;
  string local_208 [520];
  
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x98));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff507,
                        CONCAT16(in_stack_fffffffffffff506,in_stack_fffffffffffff500)),
               (char *)in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0);
    isEqualIgnoreCase(in_stack_fffffffffffff4f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff507,
                        CONCAT16(in_stack_fffffffffffff506,in_stack_fffffffffffff500)),
               (char *)in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0);
    isEqualIgnoreCase(in_stack_fffffffffffff4f8);
    OpenMD::operator||((ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_fffffffffffff55f,
                                CONCAT16(in_stack_fffffffffffff55e,in_stack_fffffffffffff558)),
                       in_stack_fffffffffffff550);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff507,
                        CONCAT16(in_stack_fffffffffffff506,in_stack_fffffffffffff500)),
               (char *)in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0);
    isEqualIgnoreCase(in_stack_fffffffffffff4f8);
    OpenMD::operator||(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_fffffffffffff4b8);
    uVar2 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()(in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    bVar3 = uVar2 ^ 0xff;
    std::__cxx11::string::~string(local_310);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)CONCAT17(in_stack_fffffffffffff4c7,
                           CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)));
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)
               CONCAT17(in_stack_fffffffffffff4c7,
                        CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)));
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)CONCAT17(in_stack_fffffffffffff4c7,
                                   CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)));
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)
               CONCAT17(in_stack_fffffffffffff4c7,
                        CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)));
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator(&local_281);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)
               CONCAT17(in_stack_fffffffffffff4c7,
                        CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)));
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator(&local_209);
    if ((bVar3 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x98));
      uVar5 = std::__cxx11::string::c_str();
      cons2 = (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_531;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff507,
                          CONCAT16(in_stack_fffffffffffff506,in_stack_fffffffffffff500)),
                 (char *)in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0);
      isEqualIgnoreCase(in_stack_fffffffffffff4f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff507,
                          CONCAT16(in_stack_fffffffffffff506,in_stack_fffffffffffff500)),
                 (char *)in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0);
      isEqualIgnoreCase(in_stack_fffffffffffff4f8);
      OpenMD::operator||((ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffff558)),cons2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff507,
                          CONCAT16(in_stack_fffffffffffff506,in_stack_fffffffffffff500)),
                 (char *)in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0);
      isEqualIgnoreCase(in_stack_fffffffffffff4f8);
      OpenMD::operator||(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_fffffffffffff4b8);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar5,uVar4);
      std::__cxx11::string::~string(local_330);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)CONCAT17(in_stack_fffffffffffff4c7,
                             CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)));
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)
                 CONCAT17(in_stack_fffffffffffff4c7,
                          CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)));
      std::__cxx11::string::~string(local_600);
      std::allocator<char>::~allocator(&local_601);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)CONCAT17(in_stack_fffffffffffff4c7,
                                     CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)))
      ;
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)
                 CONCAT17(in_stack_fffffffffffff4c7,
                          CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)));
      std::__cxx11::string::~string(local_598);
      std::allocator<char>::~allocator(&local_599);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)
                 CONCAT17(in_stack_fffffffffffff4c7,
                          CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)));
      std::__cxx11::string::~string((string *)(local_531 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_531);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xe8));
  if (!bVar1) {
    isPositive();
    data = Parameter<int>::getData((Parameter<int> *)(in_RDI + 0xe8));
    bVar1 = PositiveConstraint::operator()(&local_628,data);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x2dd34f);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xe8));
      in_stack_fffffffffffff520 =
           (ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>_> *)
           std::__cxx11::string::c_str();
      in_stack_fffffffffffff528 = &local_668;
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_fffffffffffff4b8);
      uVar5 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",
               in_stack_fffffffffffff520,uVar5);
      std::__cxx11::string::~string(local_648);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x2dd3ec);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  local_66c = 1;
  local_670 = getMaxIterations((MinimizerParameters *)0x2dd47b);
  local_678 = 0;
  local_680 = 0x3ff0000000000000;
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x118));
  if (!bVar1) {
    isGreaterThanOrEqualTo<int>((int *)in_stack_fffffffffffff4b8);
    isLessThanOrEqualTo<int>((int *)in_stack_fffffffffffff4b8);
    operator&&(in_stack_fffffffffffff528,in_stack_fffffffffffff520);
    Parameter<int>::getData((Parameter<int> *)(in_RDI + 0x118));
    bVar1 = AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,OpenMD::LessThanOrEqualToConstraint<int>>
            ::operator()((AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                          *)CONCAT17(in_stack_fffffffffffff4c7,
                                     CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)),
                         (int)((ulong)in_stack_fffffffffffff4b8 >> 0x20));
    AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
    ::~AndParamConstraint
              ((AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                *)CONCAT17(in_stack_fffffffffffff4c7,
                           CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)));
    LessThanOrEqualToConstraint<int>::~LessThanOrEqualToConstraint
              ((LessThanOrEqualToConstraint<int> *)0x2dd55b);
    GreaterThanOrEqualTo<int>::~GreaterThanOrEqualTo((GreaterThanOrEqualTo<int> *)0x2dd568);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x118));
      uVar5 = std::__cxx11::string::c_str();
      isGreaterThanOrEqualTo<int>((int *)in_stack_fffffffffffff4b8);
      isLessThanOrEqualTo<int>((int *)in_stack_fffffffffffff4b8);
      operator&&(in_stack_fffffffffffff528,in_stack_fffffffffffff520);
      ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,OpenMD::LessThanOrEqualToConstraint<int>>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>_>
                  *)in_stack_fffffffffffff4b8);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar5,uVar4);
      std::__cxx11::string::~string(local_760);
      AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
      ::~AndParamConstraint
                ((AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                  *)CONCAT17(in_stack_fffffffffffff4c7,
                             CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)));
      LessThanOrEqualToConstraint<int>::~LessThanOrEqualToConstraint
                ((LessThanOrEqualToConstraint<int> *)0x2dd64e);
      GreaterThanOrEqualTo<int>::~GreaterThanOrEqualTo((GreaterThanOrEqualTo<int> *)0x2dd65b);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x148));
  if (!bVar1) {
    isPositive();
    dVar6 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x148));
    bVar1 = PositiveConstraint::operator()(local_840,dVar6);
    bVar3 = bVar1 ^ 0xff;
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x2dd7d6);
    if ((bVar3 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x148));
      uVar5 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_fffffffffffff4b8);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar5,uVar4);
      std::__cxx11::string::~string(local_860);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x2dd873);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x1b8));
  if (!bVar1) {
    isPositive();
    dVar6 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x1b8));
    bVar1 = PositiveConstraint::operator()(local_8a0,dVar6);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x2dd95f);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x1b8));
      in_stack_fffffffffffff4d0 =
           (AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
            *)std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_fffffffffffff4b8);
      uVar5 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",
               in_stack_fffffffffffff4d0,uVar5);
      std::__cxx11::string::~string(local_8c0);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x2dd9fc);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x1f0));
  if (!bVar1) {
    isGreaterThan<double>((double *)in_stack_fffffffffffff4b8);
    isLessThanOrEqualTo<double>((double *)in_stack_fffffffffffff4b8);
    operator&&((ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *)
               in_stack_fffffffffffff528,
               (ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *)
               in_stack_fffffffffffff520);
    dVar6 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x1f0));
    uVar2 = AndParamConstraint<OpenMD::GreaterThanConstraint<double>,OpenMD::LessThanOrEqualToConstraint<double>>
            ::operator()(in_stack_fffffffffffff4d0,dVar6);
    bVar3 = uVar2 ^ 0xff;
    AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
    ::~AndParamConstraint
              ((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                *)(CONCAT17(uVar2,CONCAT16(uVar2,in_stack_fffffffffffff4c0)) ^ 0xff000000000000));
    LessThanOrEqualToConstraint<double>::~LessThanOrEqualToConstraint
              ((LessThanOrEqualToConstraint<double> *)0x2ddb33);
    GreaterThanConstraint<double>::~GreaterThanConstraint((GreaterThanConstraint<double> *)0x2ddb40)
    ;
    if ((bVar3 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x1f0));
      this_00 = (ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
                 *)std::__cxx11::string::c_str();
      isGreaterThan<double>((double *)this_00);
      isLessThanOrEqualTo<double>((double *)this_00);
      operator&&((ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *)
                 in_stack_fffffffffffff528,
                 (ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *)
                 in_stack_fffffffffffff520);
      ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,OpenMD::LessThanOrEqualToConstraint<double>>>
      ::getConstraintDescription_abi_cxx11_(this_00);
      uVar5 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",this_00,uVar5);
      std::__cxx11::string::~string(local_9c0);
      AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
      ::~AndParamConstraint
                ((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                  *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffff4c0)));
      LessThanOrEqualToConstraint<double>::~LessThanOrEqualToConstraint
                ((LessThanOrEqualToConstraint<double> *)0x2ddc24);
      GreaterThanConstraint<double>::~GreaterThanConstraint
                ((GreaterThanConstraint<double> *)0x2ddc31);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void MinimizerParameters::validate() {
    CheckParameter(Method, isEqualIgnoreCase("SD") || isEqualIgnoreCase("CG") ||
                               isEqualIgnoreCase("BFGS"));
    CheckParameter(MaxIterations, isPositive());
    int one       = 1;
    int mi        = this->getMaxIterations();
    RealType zero = 0.0;
    RealType oneR = 1.0;
    CheckParameter(MaxStationaryStateIterations,
                   isGreaterThanOrEqualTo(one) && isLessThanOrEqualTo(mi));
    CheckParameter(RootEpsilon, isPositive());
    CheckParameter(GradientNormEpsilon, isPositive());
    CheckParameter(InitialStepSize,
                   isGreaterThan(zero) && isLessThanOrEqualTo(oneR));
  }